

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ExtPubkey *
cfd::core::ConfidentialTransaction::GenerateExtPubkeyFromDescriptor
          (ExtPubkey *__return_storage_ptr__,string *bitcoin_descriptor,uint32_t bip32_counter,
          ByteData *prefix,NetType net_type,NetType elements_net_type,ExtPubkey *base_ext_pubkey,
          Address *descriptor_derive_address)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer puVar3;
  _Alloc_hider _Var4;
  char cVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  AddressType AVar9;
  int iVar10;
  long *plVar11;
  CfdException *pCVar12;
  DescriptorKeyReference *pDVar13;
  size_type *psVar14;
  uint32_t uVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list_base;
  string desc_str;
  DescriptorScriptReference derive_script;
  ExtPubkey xpub;
  DescriptorScriptReference script_ref;
  Descriptor desc;
  DescriptorKeyReference key_ref;
  string local_f30;
  NetType local_f0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ee8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ec8;
  string local_ea8;
  undefined1 local_e88 [16];
  undefined1 local_e78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e58;
  _Alloc_hider local_e48;
  _func_int **pp_Stack_e40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e38;
  pointer puStack_e28;
  _Alloc_hider local_e20;
  TapBranch local_e10;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_d98;
  Script local_d80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d40 [10];
  undefined1 local_b38 [16];
  undefined1 local_b28 [80];
  pointer puStack_ad8;
  pointer local_ad0;
  ExtPubkey local_7e8;
  undefined1 local_778 [88];
  pointer local_720;
  DescriptorNode local_428;
  DescriptorKeyReference local_2c0;
  
  local_f0c = net_type;
  if (elements_net_type == kLiquidV1) {
    bVar8 = true;
  }
  else {
    if (elements_net_type < kLiquidV1) {
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_778._0_8_ = local_778 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_778,"Illegal elements network type error.","");
      CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_778);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar8 = false;
  }
  ExtPubkey::ExtPubkey(__return_storage_ptr__);
  ExtPubkey::ExtPubkey(&local_7e8);
  local_ea8._M_dataplus._M_p = (pointer)&local_ea8.field_2;
  pcVar2 = (bitcoin_descriptor->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ea8,pcVar2,pcVar2 + bitcoin_descriptor->_M_string_length);
  ExtPubkey::ExtPubkey((ExtPubkey *)local_778,bitcoin_descriptor);
  ExtPubkey::GetVersionData((ByteData *)local_b38,(ExtPubkey *)local_778);
  bVar6 = ByteData::Equals((ByteData *)local_b38,prefix);
  if ((DescriptorKeyReference *)local_b38._0_8_ != (DescriptorKeyReference *)0x0) {
    operator_delete((void *)local_b38._0_8_);
  }
  if (bVar6) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e88,
                     "pkh(",bitcoin_descriptor);
    plVar11 = (long *)::std::__cxx11::string::append(local_e88);
    pDVar13 = (DescriptorKeyReference *)(plVar11 + 2);
    if ((DescriptorKeyReference *)*plVar11 == pDVar13) {
      local_b28._0_8_ = *(undefined8 *)pDVar13;
      local_b28._8_8_ = plVar11[3];
      local_b38._0_8_ = (DescriptorKeyReference *)local_b28;
    }
    else {
      local_b28._0_8_ = *(undefined8 *)pDVar13;
      local_b38._0_8_ = (DescriptorKeyReference *)*plVar11;
    }
    local_b38._8_8_ = plVar11[1];
    *plVar11 = (long)pDVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_ea8,(string *)local_b38);
    if ((DescriptorKeyReference *)local_b38._0_8_ != (DescriptorKeyReference *)local_b28) {
      operator_delete((void *)local_b38._0_8_);
    }
    if ((DescriptorKeyReference *)local_e88._0_8_ != (DescriptorKeyReference *)local_e78) {
      operator_delete((void *)local_e88._0_8_);
    }
  }
  if (local_720 != (pointer)0x0) {
    operator_delete(local_720);
  }
  if ((pointer)local_778._64_8_ != (pointer)0x0) {
    operator_delete((void *)local_778._64_8_);
  }
  if ((pointer)local_778._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_778._40_8_);
  }
  if ((pointer)local_778._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_778._0_8_);
  }
  local_ec8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ec8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ec8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = local_778 + 0x10;
  local_778._0_8_ = puVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"base","");
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_ec8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778);
  if ((pointer)local_778._0_8_ != puVar3) {
    operator_delete((void *)local_778._0_8_);
  }
  local_ee8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ee8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ee8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar7 = '\x01';
  if (9 < bip32_counter) {
    uVar15 = bip32_counter;
    cVar5 = '\x04';
    do {
      cVar7 = cVar5;
      if (uVar15 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_001f715b;
      }
      if (uVar15 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_001f715b;
      }
      if (uVar15 < 10000) goto LAB_001f715b;
      bVar6 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar5 = cVar7 + '\x04';
    } while (bVar6);
    cVar7 = cVar7 + '\x01';
  }
LAB_001f715b:
  local_778._0_8_ = puVar3;
  ::std::__cxx11::string::_M_construct((ulong)local_778,cVar7);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_778._0_8_,local_778._8_4_,bip32_counter);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_ee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778);
  if ((pointer)local_778._0_8_ != puVar3) {
    operator_delete((void *)local_778._0_8_);
  }
  Descriptor::Parse((Descriptor *)&local_428,&local_ea8,
                    (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)0x0);
  Descriptor::GetReference
            ((DescriptorScriptReference *)local_778,(Descriptor *)&local_428,&local_ec8);
  AVar9 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_778);
  if (AVar9 != kP2pkhAddress) {
    if ((AVar9 != kP2wpkhAddress) && (AVar9 != kP2shP2wpkhAddress)) {
      local_b38._0_8_ = "cfdcore_elements_transaction.cpp";
      local_b38._8_4_ = 0xcec;
      local_b28._0_8_ = "GenerateExtPubkeyFromDescriptor";
      logger::log<>((CfdSourceLocation *)local_b38,kCfdLogLevelWarning,
                    "bitcoin_descriptor invalid type.");
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_b38._0_8_ = local_b28;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b38,
                 "bitcoin_descriptor is not of any type supported: pkh(<xpub>), sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>."
                 ,"");
      CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_b38);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (bVar8) {
      local_b38._0_8_ = "cfdcore_elements_transaction.cpp";
      local_b38._8_4_ = 0xce4;
      local_b28._0_8_ = "GenerateExtPubkeyFromDescriptor";
      AVar9 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_778);
      local_e88._0_4_ = AVar9;
      logger::log<cfd::core::AddressType&>
                ((CfdSourceLocation *)local_b38,kCfdLogLevelWarning,
                 "liquidv1 not supported address type[{}].",(AddressType *)local_e88);
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_b38._0_8_ = local_b28;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b38,"bitcoin_descriptor is not of any type supported: pkh(<xpub>)",
                 "");
      CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_b38);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  AVar9 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_778);
  if (AVar9 == kP2shP2wpkhAddress) {
    DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)local_b38,(DescriptorScriptReference *)local_778);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_778,(DescriptorScriptReference *)local_b38);
    DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)local_b38);
  }
  DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)local_b38,(DescriptorScriptReference *)local_778);
  DescriptorKeyReference::DescriptorKeyReference
            (&local_2c0,(DescriptorKeyReference *)local_b38._0_8_);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           *)local_b38);
  bVar8 = DescriptorKeyReference::HasExtPubkey(&local_2c0);
  if (bVar8) {
    DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_b38,&local_2c0);
    puVar3 = (base_ext_pubkey->serialize_data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (base_ext_pubkey->serialize_data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b38._0_8_;
    (base_ext_pubkey->serialize_data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b38._8_8_;
    (base_ext_pubkey->serialize_data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b28._0_8_;
    local_b38._0_8_ = (pointer)0x0;
    local_b38._8_8_ = (pointer)0x0;
    local_b28._0_8_ = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    base_ext_pubkey->version_ = local_b28._8_4_;
    base_ext_pubkey->fingerprint_ = local_b28._12_4_;
    base_ext_pubkey->depth_ = local_b28[0x10];
    *(undefined3 *)&base_ext_pubkey->field_0x21 = local_b28._17_3_;
    base_ext_pubkey->child_num_ = local_b28._20_4_;
    puVar3 = (base_ext_pubkey->chaincode_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (base_ext_pubkey->chaincode_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b28._24_8_;
    (base_ext_pubkey->chaincode_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b28._32_8_;
    (base_ext_pubkey->chaincode_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b28._40_8_;
    local_b28._24_8_ = (pointer)0x0;
    local_b28._32_8_ = (pointer)0x0;
    local_b28._40_8_ = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    puVar3 = (base_ext_pubkey->pubkey_).data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (base_ext_pubkey->pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b28._48_8_;
    (base_ext_pubkey->pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b28._56_8_;
    (base_ext_pubkey->pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b28._64_8_;
    local_b28._48_8_ = (pointer)0x0;
    local_b28._56_8_ = (_func_int **)0x0;
    local_b28._64_8_ = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    puVar3 = (base_ext_pubkey->tweak_sum_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (base_ext_pubkey->tweak_sum_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b28._72_8_;
    (base_ext_pubkey->tweak_sum_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_ad8;
    (base_ext_pubkey->tweak_sum_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_ad0;
    local_b28._72_8_ = (pointer)0x0;
    puStack_ad8 = (pointer)0x0;
    local_ad0 = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
      if ((pointer)local_b28._72_8_ != (pointer)0x0) {
        operator_delete((void *)local_b28._72_8_);
      }
    }
    if ((pointer)local_b28._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_b28._48_8_);
    }
    if ((pointer)local_b28._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_b28._24_8_);
    }
    if ((pointer)local_b38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b38._0_8_);
    }
    ExtPubkey::GetVersionData((ByteData *)local_b38,base_ext_pubkey);
    bVar8 = ByteData::Equals((ByteData *)local_b38,prefix);
    if ((pointer)local_b38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b38._0_8_);
    }
    if (bVar8) {
      DescriptorScriptReference::DescriptorScriptReference((DescriptorScriptReference *)local_b38);
      Descriptor::GetReference
                ((DescriptorScriptReference *)local_e88,(Descriptor *)&local_428,&local_ee8);
      DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)local_b38,(DescriptorScriptReference *)local_e88);
      DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)local_e88);
      DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)local_778,(DescriptorScriptReference *)local_b38);
      AVar9 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_778);
      if (AVar9 == kP2shP2wpkhAddress) {
        DescriptorScriptReference::GetChild
                  ((DescriptorScriptReference *)local_e88,(DescriptorScriptReference *)local_778);
        DescriptorScriptReference::operator=
                  ((DescriptorScriptReference *)local_778,(DescriptorScriptReference *)local_e88);
        DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)local_e88);
      }
      DescriptorScriptReference::GetKeyList
                ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)local_e88,(DescriptorScriptReference *)local_778);
      DescriptorKeyReference::operator=(&local_2c0,(DescriptorKeyReference *)local_e88._0_8_);
      ::std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 *)local_e88);
      DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_e88,&local_2c0);
      puVar3 = (__return_storage_ptr__->serialize_data_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->serialize_data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_e88._0_8_;
      (__return_storage_ptr__->serialize_data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_e88._8_8_;
      (__return_storage_ptr__->serialize_data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_e78._0_8_;
      local_e88._0_8_ = (DescriptorKeyReference *)0x0;
      local_e88._8_8_ = (pointer)0x0;
      local_e78._0_8_ = (undefined1 *)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      __return_storage_ptr__->version_ = local_e78._8_4_;
      __return_storage_ptr__->fingerprint_ = local_e78._12_4_;
      __return_storage_ptr__->depth_ = local_e78[0x10];
      *(undefined3 *)&__return_storage_ptr__->field_0x21 = local_e78._17_3_;
      __return_storage_ptr__->child_num_ = local_e78._20_4_;
      puVar3 = (__return_storage_ptr__->chaincode_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->chaincode_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_e78._24_8_;
      (__return_storage_ptr__->chaincode_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)aStack_e58._M_allocated_capacity;
      (__return_storage_ptr__->chaincode_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)aStack_e58._8_8_;
      local_e78._24_8_ = (pointer)0x0;
      aStack_e58._M_allocated_capacity = 0;
      aStack_e58._8_8_ = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar3 = (__return_storage_ptr__->pubkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_e48._M_p;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pp_Stack_e40;
      (__return_storage_ptr__->pubkey_).data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_e38._M_allocated_capacity;
      local_e48._M_p = (pointer)0x0;
      pp_Stack_e40 = (_func_int **)0x0;
      local_e38._M_allocated_capacity = 0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      puVar3 = (__return_storage_ptr__->tweak_sum_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->tweak_sum_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_e38._8_8_;
      (__return_storage_ptr__->tweak_sum_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_e28;
      (__return_storage_ptr__->tweak_sum_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_e20._M_p;
      local_e38._8_8_ = (pointer)0x0;
      puStack_e28 = (pointer)0x0;
      local_e20._M_p = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        if ((pointer)local_e38._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_e38._8_8_);
        }
      }
      if ((pointer)local_e48._M_p != (pointer)0x0) {
        operator_delete(local_e48._M_p);
      }
      if ((pointer)local_e78._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_e78._24_8_);
      }
      if ((DescriptorKeyReference *)local_e88._0_8_ != (DescriptorKeyReference *)0x0) {
        operator_delete((void *)local_e88._0_8_);
      }
      ExtPubkey::ToString_abi_cxx11_((string *)local_e88,__return_storage_ptr__);
      ExtPubkey::ToString_abi_cxx11_(&local_f30,base_ext_pubkey);
      _Var4._M_p = local_f30._M_dataplus._M_p;
      if (local_e88._8_8_ == local_f30._M_string_length) {
        if ((pointer)local_e88._8_8_ == (pointer)0x0) {
          bVar8 = true;
        }
        else {
          iVar10 = bcmp((void *)local_e88._0_8_,local_f30._M_dataplus._M_p,local_e88._8_8_);
          bVar8 = iVar10 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      paVar1 = &local_f30.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != paVar1) {
        operator_delete(_Var4._M_p);
      }
      if ((DescriptorKeyReference *)local_e88._0_8_ != (DescriptorKeyReference *)local_e78) {
        operator_delete((void *)local_e88._0_8_);
      }
      if (bVar8) {
        ExtPubkey::ToString_abi_cxx11_((string *)local_e88,base_ext_pubkey);
        plVar11 = (long *)::std::__cxx11::string::append(local_e88);
        psVar14 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_f30.field_2._M_allocated_capacity = *psVar14;
          local_f30.field_2._8_8_ = plVar11[3];
          local_f30._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f30.field_2._M_allocated_capacity = *psVar14;
          local_f30._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_f30._M_string_length = plVar11[1];
        *plVar11 = (long)psVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((DescriptorKeyReference *)local_e88._0_8_ != (DescriptorKeyReference *)local_e78) {
          operator_delete((void *)local_e88._0_8_);
        }
        AVar9 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_b38);
        if (AVar9 == kP2shP2wpkhAddress) {
          ::std::operator+(&local_f08,"sh(wpkh(",&local_f30);
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_f08);
        }
        else {
          AVar9 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_b38);
          if (AVar9 == kP2wpkhAddress) {
            ::std::operator+(&local_f08,"wpkh(",&local_f30);
            plVar11 = (long *)::std::__cxx11::string::append((char *)&local_f08);
          }
          else {
            ::std::operator+(&local_f08,"pkh(",&local_f30);
            plVar11 = (long *)::std::__cxx11::string::append((char *)&local_f08);
          }
        }
        pDVar13 = (DescriptorKeyReference *)(plVar11 + 2);
        if ((DescriptorKeyReference *)*plVar11 == pDVar13) {
          local_e78._0_8_ = *(undefined8 *)pDVar13;
          local_e78._8_8_ = plVar11[3];
          local_e88._0_8_ = (DescriptorKeyReference *)local_e78;
        }
        else {
          local_e78._0_8_ = *(undefined8 *)pDVar13;
          local_e88._0_8_ = (DescriptorKeyReference *)*plVar11;
        }
        local_e88._8_8_ = plVar11[1];
        *plVar11 = (long)pDVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_f30,(string *)local_e88);
        if ((DescriptorKeyReference *)local_e88._0_8_ != (DescriptorKeyReference *)local_e78) {
          operator_delete((void *)local_e88._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f08._M_dataplus._M_p != &local_f08.field_2) {
          operator_delete(local_f08._M_dataplus._M_p);
        }
        Descriptor::Parse((Descriptor *)local_e88,&local_f30,
                          (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                           *)0x0);
        Descriptor::operator=((Descriptor *)&local_428,(Descriptor *)local_e88);
        DescriptorNode::~DescriptorNode((DescriptorNode *)local_e88);
        Descriptor::GetReference
                  ((DescriptorScriptReference *)local_e88,(Descriptor *)&local_428,&local_ee8);
        DescriptorScriptReference::operator=
                  ((DescriptorScriptReference *)local_b38,(DescriptorScriptReference *)local_e88);
        DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)local_e88);
        DescriptorScriptReference::operator=
                  ((DescriptorScriptReference *)local_778,(DescriptorScriptReference *)local_b38);
        AVar9 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_778);
        if (AVar9 == kP2shP2wpkhAddress) {
          DescriptorScriptReference::GetChild
                    ((DescriptorScriptReference *)local_e88,(DescriptorScriptReference *)local_778);
          DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_778,(DescriptorScriptReference *)local_e88);
          DescriptorScriptReference::~DescriptorScriptReference
                    ((DescriptorScriptReference *)local_e88);
        }
        DescriptorScriptReference::GetKeyList
                  ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)local_e88,(DescriptorScriptReference *)local_778);
        DescriptorKeyReference::operator=(&local_2c0,(DescriptorKeyReference *)local_e88._0_8_);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)local_e88);
        DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_e88,&local_2c0);
        puVar3 = (__return_storage_ptr__->serialize_data_).data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (__return_storage_ptr__->serialize_data_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e88._0_8_;
        (__return_storage_ptr__->serialize_data_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_e88._8_8_;
        (__return_storage_ptr__->serialize_data_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_e78._0_8_;
        local_e88._0_8_ = (DescriptorKeyReference *)0x0;
        local_e88._8_8_ = (pointer)0x0;
        local_e78._0_8_ = (undefined1 *)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        __return_storage_ptr__->version_ = local_e78._8_4_;
        __return_storage_ptr__->fingerprint_ = local_e78._12_4_;
        __return_storage_ptr__->depth_ = local_e78[0x10];
        *(undefined3 *)&__return_storage_ptr__->field_0x21 = local_e78._17_3_;
        __return_storage_ptr__->child_num_ = local_e78._20_4_;
        puVar3 = (__return_storage_ptr__->chaincode_).data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (__return_storage_ptr__->chaincode_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e78._24_8_;
        (__return_storage_ptr__->chaincode_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)aStack_e58._M_allocated_capacity;
        (__return_storage_ptr__->chaincode_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)aStack_e58._8_8_;
        local_e78._24_8_ = (pointer)0x0;
        aStack_e58._M_allocated_capacity = 0;
        aStack_e58._8_8_ = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        puVar3 = (__return_storage_ptr__->pubkey_).data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (__return_storage_ptr__->pubkey_).data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e48._M_p;
        (__return_storage_ptr__->pubkey_).data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pp_Stack_e40;
        (__return_storage_ptr__->pubkey_).data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_e38._M_allocated_capacity;
        local_e48._M_p = (pointer)0x0;
        pp_Stack_e40 = (_func_int **)0x0;
        local_e38._M_allocated_capacity = 0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
        }
        puVar3 = (__return_storage_ptr__->tweak_sum_).data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (__return_storage_ptr__->tweak_sum_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e38._8_8_;
        (__return_storage_ptr__->tweak_sum_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_e28;
        (__return_storage_ptr__->tweak_sum_).data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_e20._M_p;
        local_e38._8_8_ = (pointer)0x0;
        puStack_e28 = (pointer)0x0;
        local_e20._M_p = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3);
          if ((pointer)local_e38._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_e38._8_8_);
          }
        }
        if ((pointer)local_e48._M_p != (pointer)0x0) {
          operator_delete(local_e48._M_p);
        }
        if ((pointer)local_e78._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_e78._24_8_);
        }
        if ((DescriptorKeyReference *)local_e88._0_8_ != (DescriptorKeyReference *)0x0) {
          operator_delete((void *)local_e88._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f30._M_dataplus._M_p != paVar1) {
          operator_delete(local_f30._M_dataplus._M_p);
        }
      }
      if (descriptor_derive_address != (Address *)0x0) {
        DescriptorScriptReference::GenerateAddress
                  ((Address *)local_e88,(DescriptorScriptReference *)local_b38,local_f0c);
        core::Address::operator=(descriptor_derive_address,(Address *)local_e88);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_d40);
        Script::~Script(&local_d80);
        local_e10._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00259f80;
        ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_d98);
        TapBranch::~TapBranch(&local_e10);
        if (puStack_e28 != (pointer)0x0) {
          operator_delete(puStack_e28);
        }
        if (pp_Stack_e40 != (_func_int **)0x0) {
          operator_delete(pp_Stack_e40);
        }
        if ((pointer)aStack_e58._M_allocated_capacity != (pointer)0x0) {
          operator_delete((void *)aStack_e58._M_allocated_capacity);
        }
        if ((undefined1 *)local_e78._0_8_ != local_e78 + 0x10) {
          operator_delete((void *)local_e78._0_8_);
        }
      }
      DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)local_b38);
      DescriptorKeyReference::~DescriptorKeyReference(&local_2c0);
      DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)local_778);
      DescriptorNode::~DescriptorNode(&local_428);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_ee8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_ec8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
        operator_delete(local_ea8._M_dataplus._M_p);
      }
      if (local_7e8.tweak_sum_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_7e8.tweak_sum_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_7e8.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_7e8.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_7e8.chaincode_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_7e8.chaincode_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_7e8.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_7e8.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    local_e88._0_8_ = "cfdcore_elements_transaction.cpp";
    local_e88._8_4_ = 0xcff;
    local_e78._0_8_ = "GenerateExtPubkeyFromDescriptor";
    ExtPubkey::GetVersionData((ByteData *)&local_f30,&local_7e8);
    ByteData::GetHex_abi_cxx11_((string *)local_b38,(ByteData *)&local_f30);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_e88,kCfdLogLevelWarning,
               "bitcoin_descriptor illegal prefix[{}].",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b38);
    if ((pointer)local_b38._0_8_ != (pointer)local_b28) {
      operator_delete((void *)local_b38._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f30._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_f30._M_dataplus._M_p);
    }
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b38._0_8_ = (pointer)local_b28;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b38,"bitcoin_descriptor illegal prefix.","");
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_b38);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_b38._0_8_ = "cfdcore_elements_transaction.cpp";
  local_b38._8_4_ = 0xcf8;
  local_b28._0_8_ = "GenerateExtPubkeyFromDescriptor";
  logger::log<>((CfdSourceLocation *)local_b38,kCfdLogLevelWarning,
                "bitcoin_descriptor invalid extkey format.");
  pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b38._0_8_ = local_b28;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b38,"BitcoinDescriptor invalid extkey format.","");
  CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_b38);
  __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey ConfidentialTransaction::GenerateExtPubkeyFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &prefix, NetType net_type, NetType elements_net_type,
    ExtPubkey *base_ext_pubkey, Address *descriptor_derive_address) {
  bool is_liquidv1 = false;
  switch (elements_net_type) {
    case NetType::kMainnet:
    case NetType::kTestnet:
    case NetType::kRegtest:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal elements network type error.");
    case NetType::kLiquidV1:
      is_liquidv1 = true;
      break;
    case NetType::kElementsRegtest:
    case NetType::kCustomChain:
    default:
      break;
  }

  ExtPubkey child_xpub;
  ExtPubkey xpub;
  std::string desc_str = bitcoin_descriptor;
  try {
    // check extkey (not output descriptor)
    ExtPubkey check_key(bitcoin_descriptor);
    if (check_key.GetVersionData().Equals(prefix)) {
      desc_str = "pkh(" + bitcoin_descriptor + ")";  // create pkh descriptor
    }
  } catch (const CfdException &except) {
    info(
        CFD_LOG_SOURCE, "bitcoin_descriptor check fail. go on next check.({})",
        except.what());
    // other descriptor
  }

  std::vector<std::string> arg_list_base;
  arg_list_base.push_back(std::string(kArgumentBaseExtkey));
  std::vector<std::string> arg_list;
  arg_list.push_back(std::to_string(bip32_counter));
  Descriptor desc = Descriptor::Parse(desc_str);
  DescriptorScriptReference script_ref = desc.GetReference(&arg_list_base);
  switch (script_ref.GetAddressType()) {
    case AddressType::kP2pkhAddress:
      break;
    case AddressType::kP2wpkhAddress:
    case AddressType::kP2shP2wpkhAddress:
      if (is_liquidv1) {
        warn(
            CFD_LOG_SOURCE, "liquidv1 not supported address type[{}].",
            script_ref.GetAddressType());
        throw CfdException(
            kCfdIllegalArgumentError,
            "bitcoin_descriptor is not of any type supported: pkh(<xpub>)");
      }
      break;
    default:
      warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid type.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "bitcoin_descriptor is not of any type supported: pkh(<xpub>), "
          "sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>.");
  }

  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  DescriptorKeyReference key_ref = script_ref.GetKeyList()[0];
  if (!key_ref.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid extkey format.");
    throw CfdException(
        kCfdIllegalArgumentError, "BitcoinDescriptor invalid extkey format.");
  }
  *base_ext_pubkey = key_ref.GetExtPubkey();
  if (!base_ext_pubkey->GetVersionData().Equals(prefix)) {
    warn(
        CFD_LOG_SOURCE, "bitcoin_descriptor illegal prefix[{}].",
        xpub.GetVersionData().GetHex());
    throw CfdException(
        kCfdIllegalArgumentError, "bitcoin_descriptor illegal prefix.");
  }

  // collect derive key
  DescriptorScriptReference derive_script;
  derive_script = desc.GetReference(&arg_list);
  script_ref = derive_script;
  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  key_ref = script_ref.GetKeyList()[0];
  child_xpub = key_ref.GetExtPubkey();

  // If it is the same as base, add a default path.
  if (child_xpub.ToString() == base_ext_pubkey->ToString()) {
    std::string xpub_str = base_ext_pubkey->ToString() + "/0/*";
    if (derive_script.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      xpub_str = "sh(wpkh(" + xpub_str + "))";
    } else if (derive_script.GetAddressType() == AddressType::kP2wpkhAddress) {
      xpub_str = "wpkh(" + xpub_str + ")";
    } else {
      xpub_str = "pkh(" + xpub_str + ")";
    }
    desc = Descriptor::Parse(xpub_str);
    derive_script = desc.GetReference(&arg_list);
    script_ref = derive_script;
    if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      script_ref = script_ref.GetChild();
    }
    key_ref = script_ref.GetKeyList()[0];
    child_xpub = key_ref.GetExtPubkey();
  }

  if (descriptor_derive_address != nullptr) {
    *descriptor_derive_address = derive_script.GenerateAddress(net_type);
  }
  return child_xpub;
}